

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Problem.cpp
# Opt level: O2

void __thiscall Kernel::Problem::refreshProperty(Problem *this)

{
  undefined4 uVar1;
  Property *this_00;
  long lVar2;
  Property *pPVar3;
  
  lVar2 = DAT_00a141a0;
  uVar1 = *(undefined4 *)(DAT_00a141a0 + 600);
  *(undefined4 *)(DAT_00a141a0 + 600) = 2;
  this_00 = this->_property;
  this->_propertyValid = true;
  pPVar3 = Shell::Property::scan(this->_units);
  this->_property = pPVar3;
  if (this_00 != (Property *)0x0) {
    Shell::Property::~Property(this_00);
    ::operator_delete(this_00,0x118);
    pPVar3 = this->_property;
  }
  pPVar3->_smtlibLogic = this->_smtlibLogic;
  readDetailsFromProperty(this);
  *(undefined4 *)(lVar2 + 600) = uVar1;
  return;
}

Assistant:

void Problem::refreshProperty() const
{
  TIME_TRACE(TimeTrace::PROPERTY_EVALUATION);
  ScopedLet<ExecutionPhase> phaseLet(env.statistics->phase, ExecutionPhase::PROPERTY_SCANNING);

  auto oldProp = _property;
  _propertyValid = true;
  _property = Property::scan(_units);
  if(oldProp) {
    delete oldProp;
  }
  ASS(_property);
  _property->setSMTLIBLogic(getSMTLIBLogic());
  readDetailsFromProperty();
}